

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall
cfd::core::Psbt::Psbt(Psbt *this,uint32_t psbt_version,uint32_t version,uint32_t lock_time)

{
  string *message;
  undefined8 uVar1;
  Transaction *in_stack_fffffffffffffe90;
  allocator *paVar2;
  string *in_stack_fffffffffffffea0;
  undefined8 in_stack_fffffffffffffea8;
  CfdError error_code;
  Transaction local_138;
  undefined1 local_f2;
  allocator local_f1;
  string local_f0 [32];
  CfdSourceLocation local_d0;
  undefined1 auStack_b8 [8];
  wally_tx tx;
  string local_78 [32];
  CfdSourceLocation local_58;
  int local_2c;
  wally_psbt *pwStack_28;
  int ret;
  wally_psbt *psbt_pointer;
  uint32_t local_18;
  uint32_t lock_time_local;
  uint32_t version_local;
  uint32_t psbt_version_local;
  Psbt *this_local;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffea8 >> 0x20);
  this->_vptr_Psbt = (_func_int **)&PTR__Psbt_009f72a0;
  psbt_pointer._4_4_ = lock_time;
  local_18 = version;
  lock_time_local = psbt_version;
  _version_local = this;
  Transaction::Transaction(&this->base_tx_);
  pwStack_28 = (wally_psbt *)0x0;
  local_2c = wally_psbt_init_alloc(lock_time_local,0,0,0,&stack0xffffffffffffffd8);
  if (local_2c != 0) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x6f2;
    local_58.funcname = "Psbt";
    logger::warn<int&>(&local_58,"wally_psbt_init_alloc NG[{}]",&local_2c);
    tx.outputs_allocation_len._6_1_ = 1;
    message = (string *)__cxa_allocate_exception(0x30);
    paVar2 = (allocator *)((long)&tx.outputs_allocation_len + 7);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_78,"psbt data generate error.",paVar2);
    CfdException::CfdException((CfdException *)this,(CfdError)((ulong)paVar2 >> 0x20),message);
    tx.outputs_allocation_len._6_1_ = 0;
    __cxa_throw(message,&CfdException::typeinfo,CfdException::~CfdException);
  }
  tx.inputs_allocation_len = 0;
  tx.outputs = (wally_tx_output *)0x0;
  tx.inputs = (wally_tx_input *)0x0;
  tx.num_inputs = 0;
  tx.version = 0;
  tx.locktime = 0;
  tx.num_outputs = 0;
  auStack_b8._4_4_ = psbt_pointer._4_4_;
  auStack_b8._0_4_ = local_18;
  local_2c = wally_psbt_set_global_tx(pwStack_28,(wally_tx *)auStack_b8);
  if (local_2c != 0) {
    wally_psbt_free(pwStack_28);
    local_d0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_d0.filename = local_d0.filename + 1;
    local_d0.line = 0x6fd;
    local_d0.funcname = "Psbt";
    logger::warn<int&>(&local_d0,"wally_psbt_set_global_tx NG[{}]",&local_2c);
    local_f2 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    paVar2 = &local_f1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_f0,"psbt set tx error.",paVar2);
    CfdException::CfdException((CfdException *)this,error_code,in_stack_fffffffffffffea0);
    local_f2 = 0;
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  this->wally_psbt_pointer_ = pwStack_28;
  RebuildTransaction(&local_138,this->wally_psbt_pointer_);
  Transaction::operator=(&this->base_tx_,&local_138);
  Transaction::~Transaction(in_stack_fffffffffffffe90);
  return;
}

Assistant:

Psbt::Psbt(uint32_t psbt_version, uint32_t version, uint32_t lock_time) {
  struct wally_psbt *psbt_pointer = nullptr;
  int ret = wally_psbt_init_alloc(psbt_version, 0, 0, 0, &psbt_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_init_alloc NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt data generate error.");
  }

  struct wally_tx tx;
  memset(&tx, 0, sizeof(tx));
  tx.version = version;
  tx.locktime = lock_time;
  ret = wally_psbt_set_global_tx(psbt_pointer, &tx);
  if (ret != WALLY_OK) {
    wally_psbt_free(psbt_pointer);  // free
    warn(CFD_LOG_SOURCE, "wally_psbt_set_global_tx NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt set tx error.");
  }
  wally_psbt_pointer_ = psbt_pointer;
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
}